

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.c
# Opt level: O1

void qcc_logger_vprintf(qcc_logger *self,char *fmt,__va_list_tag *args)

{
  qcc_list_node *pqVar1;
  qcc_list_node *node;
  va_list tmp;
  __va_list_tag local_28;
  
  local_28.reg_save_area = args->reg_save_area;
  local_28.gp_offset = args->gp_offset;
  local_28.fp_offset = args->fp_offset;
  local_28.overflow_arg_area = args->overflow_arg_area;
  pqVar1 = (qcc_list_node *)qcc_arena_vsprintf(self->arena,fmt,&local_28);
  node = (qcc_list_node *)qcc_arena_alloc(self->arena,0x10);
  node->next = (qcc_list_node *)0x0;
  node[1].next = pqVar1;
  qcc_list_push_back((qcc_list *)&self->messages,node);
  return;
}

Assistant:

void qcc_logger_vprintf(struct qcc_logger *self, const char *fmt, va_list args)
{
    va_list tmp;
    va_copy(tmp, args);
    _append_message(self, qcc_arena_vsprintf(self->arena, fmt, tmp));
    va_end(tmp);
}